

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O0

ssize_t Executor::read(int __fd,void *__buf,size_t __nbytes)

{
  Var *pVVar1;
  undefined4 in_register_0000003c;
  string local_40;
  Var *local_20;
  Var *var;
  treeNode *id;
  treeNode *node_local;
  
  id = (treeNode *)CONCAT44(in_register_0000003c,__fd);
  var = (Var *)id->child[0];
  if ((((treeNode *)var)->kind).stmtKind != doRpt) {
    reportError(lackIdentifiter);
  }
  std::__cxx11::string::string((string *)&local_40,(string *)&var->kind);
  pVVar1 = getVar(&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  local_20 = pVVar1;
  if (pVVar1->kind == Text) {
    pVVar1 = (Var *)std::getline<char,std::char_traits<char>,std::allocator<char>>
                              ((istream *)&std::cin,(string *)&pVVar1->text);
  }
  else if (pVVar1->kind == Integer) {
    pVVar1 = (Var *)std::istream::operator>>(&std::cin,(int *)pVVar1);
  }
  else if (pVVar1->kind == Boolean) {
    pVVar1 = (Var *)std::istream::operator>>(&std::cin,(bool *)pVVar1);
  }
  else if (pVVar1->kind == Decmical) {
    pVVar1 = (Var *)std::istream::operator>>(&std::cin,(float *)pVVar1);
  }
  return (ssize_t)pVVar1;
}

Assistant:

void read(treeNode* node)
    {
        auto id = node->child[0];
        if(id->kind.expKind!=ExpKind::idExp)reportError(Error::lackIdentifiter);
        auto var = getVar(id->text);
        if(var->kind==AttrKind::Text)
            getline(cin,var->text);
        else if(var->kind==AttrKind::Integer)
            cin>>var->value.integer;
        else if(var->kind==AttrKind::Boolean)
            cin>>var->value.boolean;
        else if(var->kind==AttrKind::Decmical)
            cin>>var->value.decmical;
       // cout<<2333333333;
    }